

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O3

REF_STATUS ref_validation_cell_face_node(REF_GRID ref_grid,REF_INT node)

{
  int iVar1;
  int iVar2;
  REF_CELL ref_cell;
  REF_ADJ pRVar3;
  REF_NODE ref_node;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  REF_ADJ_ITEM pRVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  REF_INT face_nodes [4];
  REF_INT cell1;
  REF_INT tri_cell;
  REF_INT cell0;
  int local_68 [7];
  int local_4c;
  long local_48;
  REF_CELL local_40;
  REF_INT local_38;
  REF_INT local_34;
  
  if (-1 < node) {
    ref_cell = ref_grid->cell[8];
    pRVar3 = ref_cell->ref_adj;
    if ((node < pRVar3->nnode) && (local_48 = (long)pRVar3->first[(uint)node], local_48 != -1)) {
      ref_node = ref_grid->node;
      local_40 = ref_grid->cell[3];
      pRVar6 = pRVar3->item + local_48;
      uVar8 = (ulong)(uint)ref_cell->face_per;
      while( true ) {
        if (0 < (int)uVar8) {
          iVar1 = pRVar6->ref;
          lVar11 = 0;
          lVar10 = 0;
          do {
            pRVar4 = ref_cell->c2n;
            iVar2 = ref_cell->size_per;
            pRVar5 = ref_cell->f2n;
            lVar9 = 0;
            do {
              local_68[lVar9] =
                   pRVar4[(long)*(int *)((long)pRVar5 + lVar9 * 4 + lVar11) +
                          (long)iVar2 * (long)iVar1];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 4);
            pRVar4 = ref_node->part;
            iVar2 = ref_node->ref_mpi->id;
            if ((((iVar2 == pRVar4[local_68[0]]) || (iVar2 == pRVar4[local_68[1]])) ||
                (iVar2 == pRVar4[local_68[2]])) || (iVar2 == pRVar4[local_68[3]])) {
              uVar7 = ref_cell_with_face(ref_cell,local_68,&local_34,&local_4c);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x102,"ref_validation_cell_face_node",(ulong)uVar7,"two expected");
                ref_node_location(ref_node,local_68[0]);
                ref_node_location(ref_node,local_68[1]);
                ref_node_location(ref_node,local_68[2]);
                ref_node_location(ref_node,local_68[3]);
                ref_validation_node_cell(ref_cell,local_68[0]);
                ref_validation_node_cell(ref_cell,local_68[1]);
                ref_validation_node_cell(ref_cell,local_68[2]);
                return uVar7;
              }
              if ((local_4c == -1) &&
                 (uVar7 = ref_cell_with(local_40,local_68,&local_38), uVar7 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x109,"ref_validation_cell_face_node",(ulong)uVar7,"matching tri");
                ref_node_location(ref_node,local_68[0]);
                ref_node_location(ref_node,local_68[1]);
                ref_node_location(ref_node,local_68[2]);
                ref_node_location(ref_node,local_68[3]);
                return uVar7;
              }
            }
            lVar10 = lVar10 + 1;
            uVar8 = (ulong)ref_cell->face_per;
            lVar11 = lVar11 + 0x10;
          } while (lVar10 < (long)uVar8);
        }
        pRVar6 = ref_cell->ref_adj->item;
        local_48 = (long)pRVar6[(int)local_48].next;
        if (local_48 == -1) break;
        pRVar6 = pRVar6 + local_48;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_face_node(REF_GRID ref_grid,
                                                 REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tet = ref_grid_tet(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_face;
  REF_INT face_node, face_nodes[4];
  REF_INT cell0, cell1, tri_cell;

  each_ref_cell_having_node(tet, node, item, cell) {
    each_ref_cell_cell_face(tet, cell_face) {
      for (face_node = 0; face_node < 4; face_node++) {
        face_nodes[face_node] = ref_cell_f2n(tet, face_node, cell_face, cell);
      }
      if (ref_node_owned(ref_node, face_nodes[0]) ||
          ref_node_owned(ref_node, face_nodes[1]) ||
          ref_node_owned(ref_node, face_nodes[2]) ||
          ref_node_owned(ref_node, face_nodes[3])) {
        RSB(ref_cell_with_face(tet, face_nodes, &cell0, &cell1), "two expected",
            {
              ref_node_location(ref_node, face_nodes[0]);
              ref_node_location(ref_node, face_nodes[1]);
              ref_node_location(ref_node, face_nodes[2]);
              ref_node_location(ref_node, face_nodes[3]);
              ref_validation_node_cell(tet, face_nodes[0]);
              ref_validation_node_cell(tet, face_nodes[1]);
              ref_validation_node_cell(tet, face_nodes[2]);
            });
        if (REF_EMPTY == cell1) { /* should have tri on other side */
          RSB(ref_cell_with(tri, face_nodes, &tri_cell), "matching tri", {
            ref_node_location(ref_node, face_nodes[0]);
            ref_node_location(ref_node, face_nodes[1]);
            ref_node_location(ref_node, face_nodes[2]);
            ref_node_location(ref_node, face_nodes[3]);
          });
        }
      }
    }
  }

  return REF_SUCCESS;
}